

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall
QTreeViewPrivate::widthHintForIndex
          (QTreeViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option,int i)

{
  bool bVar1;
  int iVar2;
  QTreeView *pQVar3;
  long *plVar4;
  int *piVar5;
  undefined8 in_RCX;
  int in_EDX;
  QModelIndex *in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int xhint;
  QTreeView *q;
  int max;
  int min;
  QWidget *editor;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_48;
  undefined8 local_44;
  QSize local_3c;
  int local_34;
  QSize local_30;
  int local_28;
  undefined8 local_24;
  int local_1c;
  QWidget *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  pQVar3 = q_func(in_RDI);
  QAbstractItemViewPrivate::editorForIndex
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(QModelIndex *)in_RDI);
  local_18 = QPointer<QWidget>::data((QPointer<QWidget> *)0x8f6c52);
  if ((local_18 != (QWidget *)0x0) &&
     (bVar1 = QSet<QWidget_*>::contains
                        ((QSet<QWidget_*> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (QWidget **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
     bVar1)) {
    local_24 = (**(code **)(*(long *)local_18 + 0x70))();
    local_1c = QSize::width((QSize *)0x8f6ca8);
    piVar5 = qMax<int>(&local_c,&local_1c);
    local_c = *piVar5;
    local_30 = QWidget::minimumSize((QWidget *)in_RDI);
    local_28 = QSize::width((QSize *)0x8f6ce3);
    local_3c = QWidget::maximumSize((QWidget *)in_RDI);
    local_34 = QSize::width((QSize *)0x8f6d03);
    piVar5 = qBound<int>((int *)in_RDI,
                         (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_c = *piVar5;
  }
  plVar4 = (long *)(**(code **)(*(long *)&(pQVar3->super_QAbstractItemView).
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x208))(pQVar3,in_RSI);
  local_44 = (**(code **)(*plVar4 + 0x68))(plVar4,in_RCX,in_RSI);
  iVar2 = QSize::width((QSize *)0x8f6d5c);
  QModelIndex::column(in_RSI);
  bVar1 = isTreePosition((QTreeViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c);
  if (bVar1) {
    local_48 = indentationForItem((QTreeViewPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffff78),
                                  in_stack_ffffffffffffff74);
  }
  else {
    local_48 = 0;
  }
  local_48 = iVar2 + local_48;
  piVar5 = qMax<int>(&local_c,&local_48);
  local_c = *piVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

int QTreeViewPrivate::widthHintForIndex(const QModelIndex &index, int hint, const QStyleOptionViewItem &option, int i) const
{
    Q_Q(const QTreeView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().width());
        int min = editor->minimumSize().width();
        int max = editor->maximumSize().width();
        hint = qBound(min, hint, max);
    }
    int xhint = q->itemDelegateForIndex(index)->sizeHint(option, index).width();
    hint = qMax(hint, xhint + (isTreePosition(index.column()) ? indentationForItem(i) : 0));
    return hint;
}